

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool ClipperLib::Orientation(OutRec *outRec,bool UseFullInt64Range)

{
  long _lo;
  bool local_e2;
  bool local_e1;
  Int128 local_e0;
  Int128 local_d0;
  Int128 local_c0;
  Int128 local_b0;
  Int128 local_a0;
  Int128 local_90;
  Int128 local_80;
  Int128 local_70;
  undefined1 local_60 [8];
  IntPoint ip2;
  IntPoint ip1;
  OutPt *opNext;
  OutPt *opPrev;
  OutPt *op;
  OutPt *opBottom;
  bool UseFullInt64Range_local;
  OutRec *outRec_local;
  
  if (outRec->pts == (OutPt *)0x0) {
    outRec_local._7_1_ = false;
  }
  else {
    op = outRec->pts;
    for (opPrev = outRec->pts->next; opPrev != outRec->pts; opPrev = opPrev->next) {
      if (((op->pt).Y <= (opPrev->pt).Y) &&
         (((op->pt).Y < (opPrev->pt).Y || ((opPrev->pt).X < (op->pt).X)))) {
        op = opPrev;
      }
    }
    outRec->bottomPt = op;
    op->idx = outRec->idx;
    opNext = op->prev;
    ip1.Y = (long64)op->next;
    while( true ) {
      local_e1 = false;
      if (op != opNext) {
        local_e1 = PointsEqual(&op->pt,&opNext->pt);
      }
      if (local_e1 == false) break;
      opNext = opNext->prev;
    }
    while( true ) {
      local_e2 = false;
      if (op != (OutPt *)ip1.Y) {
        local_e2 = PointsEqual(&op->pt,(IntPoint *)(ip1.Y + 8));
      }
      if (local_e2 == false) break;
      ip1.Y = *(long64 *)(ip1.Y + 0x18);
    }
    IntPoint::IntPoint((IntPoint *)&ip2.Y,0,0);
    IntPoint::IntPoint((IntPoint *)local_60,0,0);
    ip2.Y = (op->pt).X - (opNext->pt).X;
    _lo = (op->pt).Y - (opNext->pt).Y;
    local_60 = (undefined1  [8])(*(long *)(ip1.Y + 8) - (op->pt).X);
    ip2.X = *(long *)(ip1.Y + 0x10) - (op->pt).Y;
    if (UseFullInt64Range) {
      Int128::Int128(&local_90,ip2.Y);
      Int128::Int128(&local_a0,ip2.X);
      Int128::operator*(&local_80,&local_90);
      Int128::Int128(&local_c0,(long64)local_60);
      Int128::Int128(&local_d0,_lo);
      Int128::operator*(&local_b0,&local_c0);
      Int128::operator-(&local_70,&local_80);
      Int128::Int128(&local_e0,0);
      outRec_local._7_1_ = Int128::operator>=(&local_70,&local_e0);
    }
    else {
      outRec_local._7_1_ = -1 < ip2.Y * ip2.X - (long)local_60 * _lo;
    }
  }
  return outRec_local._7_1_;
}

Assistant:

bool Orientation(OutRec *outRec, bool UseFullInt64Range)
{
  if (!outRec->pts)
    return 0.0;

  //first make sure bottomPt is correctly assigned ...
  OutPt *opBottom = outRec->pts, *op = outRec->pts->next;
  while (op != outRec->pts)
  {
    if (op->pt.Y >= opBottom->pt.Y)
    {
      if (op->pt.Y > opBottom->pt.Y || op->pt.X < opBottom->pt.X)
      opBottom = op;
    }
    op = op->next;
  }
  outRec->bottomPt = opBottom;
  opBottom->idx = outRec->idx;

  op = opBottom;
  //find vertices either side of bottomPt (skipping duplicate points) ....
  OutPt *opPrev = op->prev;
  OutPt *opNext = op->next;
  while (op != opPrev && PointsEqual(op->pt, opPrev->pt))
    opPrev = opPrev->prev;
  while (op != opNext && PointsEqual(op->pt, opNext->pt))
    opNext = opNext->next;

  IntPoint ip1, ip2;
  ip1.X = op->pt.X - opPrev->pt.X;
  ip1.Y = op->pt.Y - opPrev->pt.Y;
  ip2.X = opNext->pt.X - op->pt.X;
  ip2.Y = opNext->pt.Y - op->pt.Y;

  if (UseFullInt64Range)
    return Int128(ip1.X) * Int128(ip2.Y) - Int128(ip2.X) * Int128(ip1.Y) >= 0;
  else
    return (ip1.X * ip2.Y - ip2.X * ip1.Y) >= 0;
}